

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall
amrex::AmrLevel::AmrLevel
          (AmrLevel *this,Amr *papa,int lev,Geometry *level_geom,BoxArray *ba,
          DistributionMapping *dm,Real time)

{
  initializer_list<int> iVar1;
  bool bVar2;
  int iVar3;
  IndexSpace *pIVar4;
  long lVar5;
  Long LVar6;
  StateData *pSVar7;
  void *in_RCX;
  undefined4 in_EDX;
  Amr *in_RSI;
  AmrLevel *in_RDI;
  BoxArray *in_XMM0_Qa;
  IntVect IVar8;
  RegionTag level_tag;
  RegionTag statedata_index_new_tag;
  RegionTag statedata_index_tag;
  RegionTag statedata_tag;
  int i;
  undefined4 in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  Amr *in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  AmrMesh *in_stack_fffffffffffffbe0;
  size_type in_stack_fffffffffffffbe8;
  EBSupport a_support;
  vector<amrex::StateData,_std::allocator<amrex::StateData>_> *in_stack_fffffffffffffbf0;
  StateDescriptor *in_stack_fffffffffffffbf8;
  BoxArray *in_stack_fffffffffffffc00;
  Geometry *in_stack_fffffffffffffc08;
  int iVar9;
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  *factory;
  undefined1 *dt;
  BoxArray *time_00;
  StateDescriptor *d;
  BoxArray *dm_00;
  BoxArray *grds;
  Box *p_domain;
  string local_340 [32];
  string local_320 [40];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [40];
  string local_250 [32];
  string local_230 [16];
  AmrLevel *in_stack_fffffffffffffde0;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [40];
  string local_1a8 [32];
  string local_188 [36];
  int local_164;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 *local_148;
  undefined8 local_140;
  int local_118 [3];
  undefined8 local_104;
  int local_fc;
  int local_f8 [3];
  undefined8 local_e4;
  int local_dc;
  int local_d8 [2];
  int local_d0;
  int local_c4 [2];
  int local_bc;
  int local_b8 [2];
  int local_b0;
  int local_a8 [2];
  int local_a0;
  BoxArray *local_90;
  undefined4 local_6c;
  Amr *local_68;
  int local_58 [2];
  int local_50;
  IntVect local_44;
  int local_38 [2];
  int local_30;
  IntVect local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  (((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
     *)&in_RDI->_vptr_AmrLevel)->_M_t).
  super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       (FabFactory<amrex::FArrayBox> *)&PTR__AmrLevel_01aa4af0;
  local_90 = in_XMM0_Qa;
  local_6c = in_EDX;
  local_68 = in_RSI;
  memcpy(&in_RDI->geom,in_RCX,200);
  dm_00 = &in_RDI->grids;
  BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffffbd0,
                     (BoxArray *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  grds = (BoxArray *)&in_RDI->dmap;
  DistributionMapping::DistributionMapping
            ((DistributionMapping *)in_stack_fffffffffffffbd0,
             (DistributionMapping *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  IntVect::IntVect(&in_RDI->crse_ratio);
  IntVect::IntVect(&in_RDI->fine_ratio);
  p_domain = (Box *)&in_RDI->state;
  Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::Vector
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)0x139329b);
  BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffffbd0);
  Box::Box((Box *)in_stack_fffffffffffffbd0);
  factory = &in_RDI->m_factory;
  std::
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>
  ::unique_ptr<std::default_delete<amrex::FabFactory<amrex::FArrayBox>>,void>
            ((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              *)in_stack_fffffffffffffbd0);
  dt = &in_RDI->field_0x220;
  time_00 = &in_RDI->nodal_grids;
  d = (StateDescriptor *)dt;
  do {
    BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffffbd0);
    d = (StateDescriptor *)((long)d + 0x68);
  } while (d != (StateDescriptor *)time_00);
  BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffffbd0);
  in_RDI->level = local_6c;
  in_RDI->parent = local_68;
  in_RDI->levelDirectoryCreated = false;
  IntVect::IntVect(&local_28,1);
  local_30 = local_28.vect[2];
  local_38[0] = local_28.vect[0];
  local_38[1] = local_28.vect[1];
  local_b0 = local_28.vect[2];
  local_b8[0] = local_28.vect[0];
  local_b8[1] = local_28.vect[1];
  local_a0 = local_28.vect[2];
  local_a8[0] = local_28.vect[0];
  local_a8[1] = local_28.vect[1];
  local_8 = &in_RDI->fine_ratio;
  (in_RDI->fine_ratio).vect[2] = local_28.vect[2];
  *(undefined8 *)(in_RDI->fine_ratio).vect = local_28.vect._0_8_;
  local_c = 0xffffffff;
  local_8->vect[0] = -local_8->vect[0];
  (in_RDI->fine_ratio).vect[1] = -(in_RDI->fine_ratio).vect[1];
  (in_RDI->fine_ratio).vect[2] = -(in_RDI->fine_ratio).vect[2];
  IntVect::IntVect(&local_44,1);
  local_50 = local_44.vect[2];
  local_58[0] = local_44.vect[0];
  local_58[1] = local_44.vect[1];
  local_d0 = local_44.vect[2];
  local_d8[0] = local_44.vect[0];
  local_d8[1] = local_44.vect[1];
  local_c4[0] = local_44.vect[0];
  local_c4[1] = local_44.vect[1];
  local_bc = local_44.vect[2];
  *(undefined8 *)(in_RDI->crse_ratio).vect = local_44.vect._0_8_;
  (in_RDI->crse_ratio).vect[2] = local_44.vect[2];
  local_18 = &in_RDI->crse_ratio;
  local_1c = 0xffffffff;
  local_18->vect[0] = -local_18->vect[0];
  (in_RDI->crse_ratio).vect[1] = -(in_RDI->crse_ratio).vect[1];
  (in_RDI->crse_ratio).vect[2] = -(in_RDI->crse_ratio).vect[2];
  if (0 < in_RDI->level) {
    IVar8 = AmrMesh::refRatio(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
    local_f8._0_8_ = IVar8.vect._0_8_;
    local_e4._0_4_ = local_f8[0];
    local_e4._4_4_ = local_f8[1];
    local_f8[2] = IVar8.vect[2];
    local_dc = local_f8[2];
    *(undefined8 *)(in_RDI->crse_ratio).vect = local_f8._0_8_;
    (in_RDI->crse_ratio).vect[2] = local_f8[2];
    local_f8 = IVar8.vect;
  }
  iVar9 = in_RDI->level;
  iVar3 = AmrMesh::maxLevel((AmrMesh *)in_RDI->parent);
  if (iVar9 < iVar3) {
    IVar8 = AmrMesh::refRatio(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
    local_118._0_8_ = IVar8.vect._0_8_;
    local_104._0_4_ = local_118[0];
    local_104._4_4_ = local_118[1];
    local_118[2] = IVar8.vect[2];
    local_fc = local_118[2];
    *(undefined8 *)(in_RDI->fine_ratio).vect = local_118._0_8_;
    (in_RDI->fine_ratio).vect[2] = local_118[2];
    local_118 = IVar8.vect;
  }
  DescriptorList::size((DescriptorList *)0x139372c);
  std::vector<amrex::StateData,_std::allocator<amrex::StateData>_>::resize
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  a_support = (EBSupport)(in_stack_fffffffffffffbe8 >> 0x20);
  pIVar4 = EB2::TopIndexSpaceIfPresent();
  if (pIVar4 == (IndexSpace *)0x0) {
    std::make_unique<amrex::DefaultFabFactory<amrex::FArrayBox>>();
    std::
    unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>
    ::operator=((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 *)in_stack_fffffffffffffbe0,
                (unique_ptr<amrex::DefaultFabFactory<amrex::FArrayBox>,_std::default_delete<amrex::DefaultFabFactory<amrex::FArrayBox>_>_>
                 *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    std::
    unique_ptr<amrex::DefaultFabFactory<amrex::FArrayBox>,_std::default_delete<amrex::DefaultFabFactory<amrex::FArrayBox>_>_>
    ::~unique_ptr((unique_ptr<amrex::DefaultFabFactory<amrex::FArrayBox>,_std::default_delete<amrex::DefaultFabFactory<amrex::FArrayBox>_>_>
                   *)in_stack_fffffffffffffbd0);
  }
  else {
    local_154 = m_eb_basic_grow_cells;
    local_150 = m_eb_volume_grow_cells;
    local_14c = m_eb_full_grow_cells;
    local_148 = &local_154;
    local_140 = 3;
    std::allocator<int>::allocator((allocator<int> *)0x13937ca);
    iVar1._M_array._4_4_ = in_stack_fffffffffffffbdc;
    iVar1._M_array._0_4_ = in_stack_fffffffffffffbd8;
    iVar1._M_len = (size_type)in_stack_fffffffffffffbe0;
    Vector<int,_std::allocator<int>_>::vector
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbd0,iVar1,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    makeEBFabFactory(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                     (DistributionMapping *)in_stack_fffffffffffffbf8,
                     (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,a_support);
    std::
    unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>
    ::operator=((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 *)in_stack_fffffffffffffbe0,
                (unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                 *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    std::unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>::
    ~unique_ptr((unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                 *)in_stack_fffffffffffffbe0);
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x1393851);
    std::allocator<int>::~allocator((allocator<int> *)0x139385e);
  }
  local_164 = 0;
  while( true ) {
    lVar5 = (long)local_164;
    LVar6 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::size
                      ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)0x1393929);
    if (LVar6 <= lVar5) break;
    std::__cxx11::to_string((int)((ulong)lVar5 >> 0x20));
    iVar9 = (int)((ulong)lVar5 >> 0x20);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbd0);
    FabArrayBase::RegionTag::RegionTag
              ((RegionTag *)in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::to_string(iVar9);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbd0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   (char *)in_stack_fffffffffffffbd0);
    std::__cxx11::to_string(iVar9);
    std::operator+((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
                    *)in_stack_fffffffffffffc08,
                   (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
                    *)in_stack_fffffffffffffc00);
    FabArrayBase::RegionTag::RegionTag
              ((RegionTag *)in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::to_string(iVar9);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbd0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   (char *)in_stack_fffffffffffffbd0);
    std::__cxx11::to_string(iVar9);
    std::operator+((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
                    *)in_stack_fffffffffffffc08,
                   (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
                    *)in_stack_fffffffffffffc00);
    FabArrayBase::RegionTag::RegionTag
              ((RegionTag *)in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8);
    std::__cxx11::string::~string(local_278);
    std::__cxx11::string::~string(local_2f8);
    std::__cxx11::string::~string(local_298);
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::string::~string(local_2d8);
    std::__cxx11::to_string(iVar9);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbd0);
    FabArrayBase::RegionTag::RegionTag
              ((RegionTag *)in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8);
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string(local_340);
    pSVar7 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                       ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                        in_stack_fffffffffffffbd0,
                        CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    in_stack_fffffffffffffbd8 = SUB84(pSVar7,0);
    in_stack_fffffffffffffbdc = (int)((ulong)pSVar7 >> 0x20);
    Geometry::Domain(&in_RDI->geom);
    in_stack_fffffffffffffbf8 =
         DescriptorList::operator[]
                   ((DescriptorList *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc);
    in_stack_fffffffffffffc00 = local_90;
    in_stack_fffffffffffffc08 =
         (Geometry *)Amr::dtLevel(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc);
    std::
    unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 *)in_stack_fffffffffffffbd0);
    StateData::define((StateData *)in_RDI,p_domain,grds,(DistributionMapping *)dm_00,d,(Real)time_00
                      ,(Real)dt,(FabFactory<amrex::FArrayBox> *)factory);
    FabArrayBase::RegionTag::~RegionTag((RegionTag *)0x1393cc0);
    FabArrayBase::RegionTag::~RegionTag((RegionTag *)0x1393ccd);
    FabArrayBase::RegionTag::~RegionTag((RegionTag *)0x1393cda);
    FabArrayBase::RegionTag::~RegionTag((RegionTag *)0x1393ce7);
    local_164 = local_164 + 1;
  }
  bVar2 = AmrMesh::useFixedCoarseGrids((AmrMesh *)in_RDI->parent);
  if (bVar2) {
    constructAreaNotToTag(in_stack_fffffffffffffde0);
  }
  in_RDI->post_step_regrid = 0;
  finishConstructor(in_RDI);
  return;
}

Assistant:

AmrLevel::AmrLevel (Amr&            papa,
                    int             lev,
                    const Geometry& level_geom,
                    const BoxArray& ba,
                    const DistributionMapping& dm,
                    Real            time)
    :
    geom(level_geom),
    grids(ba),
    dmap(dm)
{
    BL_PROFILE("AmrLevel::AmrLevel(dm)");
    level  = lev;
    parent = &papa;
    levelDirectoryCreated = false;

    fine_ratio = IntVect::TheUnitVector(); fine_ratio.scale(-1);
    crse_ratio = IntVect::TheUnitVector(); crse_ratio.scale(-1);

    if (level > 0)
    {
        crse_ratio = parent->refRatio(level-1);
    }
    if (level < parent->maxLevel())
    {
        fine_ratio = parent->refRatio(level);
    }

    state.resize(desc_lst.size());

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        m_factory = makeEBFabFactory(geom, ba, dm,
                                     {m_eb_basic_grow_cells,
                                      m_eb_volume_grow_cells,
                                      m_eb_full_grow_cells},
                                     m_eb_support_level);
    } else
#endif
    {
        m_factory = std::make_unique<FArrayBoxFactory>();
    }

    // Note that this creates a distribution map associated with grids.
    for (int i = 0; i < state.size(); i++)
    {
        MultiFab::RegionTag statedata_tag("StateData_Level_" + std::to_string(lev));
        MultiFab::RegionTag statedata_index_tag("StateData_" + std::to_string(i) + "_Level_" + std::to_string(lev));
        MultiFab::RegionTag statedata_index_new_tag("StateData_" + std::to_string(i) + "_New_Level_" + std::to_string(lev));
        MultiFab::RegionTag level_tag("AmrLevel_Level_" + std::to_string(lev));
        state[i].define(geom.Domain(),
                        grids,
                        dm,
                        desc_lst[i],
                        time,
                        parent->dtLevel(lev),
                        *m_factory);
    }

    if (parent->useFixedCoarseGrids()) constructAreaNotToTag();

    post_step_regrid = 0;

    finishConstructor();
}